

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive_impl.h
# Opt level: O0

void test_exhaustive_schnorrsig(secp256k1_context *ctx)

{
  int iVar1;
  uchar buf [32];
  secp256k1_scalar scalar_i;
  secp256k1_xonly_pubkey pk;
  uint i;
  uchar xonly_pubkey_bytes [12] [32];
  int parity [12];
  secp256k1_xonly_pubkey xonly_pubkey [12];
  secp256k1_keypair keypair [12];
  undefined4 in_stack_fffffffffffff658;
  uint in_stack_fffffffffffff65c;
  secp256k1_scalar *in_stack_fffffffffffff660;
  secp256k1_xonly_pubkey *in_stack_fffffffffffff6b8;
  undefined4 in_stack_fffffffffffff6c0;
  uint uVar2;
  secp256k1_context *in_stack_fffffffffffff6c8;
  secp256k1_keypair *in_stack_fffffffffffff6d0;
  secp256k1_context *in_stack_fffffffffffff6d8;
  uchar *in_stack_fffffffffffff6e8;
  secp256k1_xonly_pubkey *in_stack_fffffffffffff6f0;
  secp256k1_context *in_stack_fffffffffffff6f8;
  int *in_stack_fffffffffffff758;
  secp256k1_keypair *in_stack_fffffffffffff760;
  secp256k1_xonly_pubkey *in_stack_fffffffffffff768;
  secp256k1_context *in_stack_fffffffffffff770;
  
  for (uVar2 = 0; uVar2 < 7; uVar2 = uVar2 + 1) {
    iVar1 = secp256k1_xonly_pubkey_parse
                      (in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8
                      );
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/schnorrsig/tests_exhaustive_impl.h"
              ,0xc4,
              "test condition failed: !secp256k1_xonly_pubkey_parse(ctx, &pk, invalid_pubkey_bytes[i])"
             );
      abort();
    }
  }
  uVar2 = 1;
  while( true ) {
    if (0xc < uVar2) {
      test_exhaustive_schnorrsig_sign
                (in_stack_fffffffffffff770,in_stack_fffffffffffff768->data,in_stack_fffffffffffff760
                 ,in_stack_fffffffffffff758);
      test_exhaustive_schnorrsig_verify
                (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760->data
                 ,in_stack_fffffffffffff758);
      return;
    }
    secp256k1_scalar_set_int(in_stack_fffffffffffff660,in_stack_fffffffffffff65c);
    secp256k1_scalar_get_b32
              ((uchar *)in_stack_fffffffffffff660,
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    iVar1 = secp256k1_keypair_create
                      (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,
                       (uchar *)in_stack_fffffffffffff6c8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/schnorrsig/tests_exhaustive_impl.h"
              ,0xcd,"test condition failed: secp256k1_keypair_create(ctx, &keypair[i - 1], buf)");
      abort();
    }
    iVar1 = secp256k1_keypair_xonly_pub
                      (in_stack_fffffffffffff6d8,(secp256k1_xonly_pubkey *)in_stack_fffffffffffff6d0
                       ,(int *)in_stack_fffffffffffff6c8,
                       (secp256k1_keypair *)CONCAT44(uVar2,in_stack_fffffffffffff6c0));
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/schnorrsig/tests_exhaustive_impl.h"
              ,0xce,
              "test condition failed: secp256k1_keypair_xonly_pub(ctx, &xonly_pubkey[i - 1], &parity[i - 1], &keypair[i - 1])"
             );
      abort();
    }
    iVar1 = secp256k1_xonly_pubkey_serialize
                      (in_stack_fffffffffffff6c8,(uchar *)CONCAT44(uVar2,in_stack_fffffffffffff6c0),
                       in_stack_fffffffffffff6b8);
    if (iVar1 == 0) break;
    uVar2 = uVar2 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/schnorrsig/tests_exhaustive_impl.h"
          ,0xcf,
          "test condition failed: secp256k1_xonly_pubkey_serialize(ctx, xonly_pubkey_bytes[i - 1], &xonly_pubkey[i - 1])"
         );
  abort();
}

Assistant:

static void test_exhaustive_schnorrsig(const secp256k1_context *ctx) {
    secp256k1_keypair keypair[EXHAUSTIVE_TEST_ORDER - 1];
    secp256k1_xonly_pubkey xonly_pubkey[EXHAUSTIVE_TEST_ORDER - 1];
    int parity[EXHAUSTIVE_TEST_ORDER - 1];
    unsigned char xonly_pubkey_bytes[EXHAUSTIVE_TEST_ORDER - 1][32];
    unsigned i;

    /* Verify that all invalid_pubkey_bytes are actually invalid. */
    for (i = 0; i < NUM_INVALID_KEYS; ++i) {
        secp256k1_xonly_pubkey pk;
        CHECK(!secp256k1_xonly_pubkey_parse(ctx, &pk, invalid_pubkey_bytes[i]));
    }

    /* Construct keypairs and xonly-pubkeys for the entire group. */
    for (i = 1; i < EXHAUSTIVE_TEST_ORDER; ++i) {
        secp256k1_scalar scalar_i;
        unsigned char buf[32];
        secp256k1_scalar_set_int(&scalar_i, i);
        secp256k1_scalar_get_b32(buf, &scalar_i);
        CHECK(secp256k1_keypair_create(ctx, &keypair[i - 1], buf));
        CHECK(secp256k1_keypair_xonly_pub(ctx, &xonly_pubkey[i - 1], &parity[i - 1], &keypair[i - 1]));
        CHECK(secp256k1_xonly_pubkey_serialize(ctx, xonly_pubkey_bytes[i - 1], &xonly_pubkey[i - 1]));
    }

    test_exhaustive_schnorrsig_sign(ctx, xonly_pubkey_bytes, keypair, parity);
    test_exhaustive_schnorrsig_verify(ctx, xonly_pubkey, xonly_pubkey_bytes, parity);
}